

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

uint32_t __thiscall
asmjit::v1_14::RALocalAllocator::decideOnSpillFor
          (RALocalAllocator *this,RegGroup group,uint32_t workId,RegMask spillableRegs,
          uint32_t *spillWorkId)

{
  RAAssignment *pRVar1;
  uint32_t physId;
  uint32_t workId_00;
  uint32_t uVar2;
  uint32_t physId_00;
  uint32_t workId_01;
  uint32_t uVar3;
  BitWordIterator<unsigned_int> it;
  RegMask local_4c;
  RALocalAllocator *local_48;
  uint32_t *local_40;
  RAAssignment *local_38;
  
  local_48 = this;
  if (spillableRegs != 0) {
    local_4c = spillableRegs;
    local_40 = spillWorkId;
    physId = Support::BitWordIterator<unsigned_int>::next
                       ((BitWordIterator<unsigned_int> *)&local_4c);
    pRVar1 = &local_48->_curAssignment;
    workId_00 = RAAssignment::physToWorkId(pRVar1,group,physId);
    if (local_4c != 0) {
      uVar2 = calculateSpillCost(local_48,group,workId_00,physId);
      local_38 = pRVar1;
      do {
        pRVar1 = local_38;
        physId_00 = Support::BitWordIterator<unsigned_int>::next
                              ((BitWordIterator<unsigned_int> *)&local_4c);
        workId_01 = RAAssignment::physToWorkId(pRVar1,group,physId_00);
        uVar3 = calculateSpillCost(local_48,group,workId_01,physId_00);
        if (uVar3 < uVar2) {
          physId = physId_00;
          uVar2 = uVar3;
          workId_00 = workId_01;
        }
      } while (local_4c != 0);
    }
    *local_40 = workId_00;
    return physId;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/ralocal.cpp"
             ,0x4a1,"spillableRegs != 0");
}

Assistant:

uint32_t RALocalAllocator::decideOnSpillFor(RegGroup group, uint32_t workId, RegMask spillableRegs, uint32_t* spillWorkId) const noexcept {
  // May be used in the future to decide which register would be best to spill so `workId` can be assigned.
  DebugUtils::unused(workId);
  ASMJIT_ASSERT(spillableRegs != 0);

  Support::BitWordIterator<RegMask> it(spillableRegs);
  uint32_t bestPhysId = it.next();
  uint32_t bestWorkId = _curAssignment.physToWorkId(group, bestPhysId);

  // Avoid calculating the cost model if there is only one spillable register.
  if (it.hasNext()) {
    uint32_t bestCost = calculateSpillCost(group, bestWorkId, bestPhysId);
    do {
      uint32_t localPhysId = it.next();
      uint32_t localWorkId = _curAssignment.physToWorkId(group, localPhysId);
      uint32_t localCost = calculateSpillCost(group, localWorkId, localPhysId);

      if (localCost < bestCost) {
        bestCost = localCost;
        bestPhysId = localPhysId;
        bestWorkId = localWorkId;
      }
    } while (it.hasNext());
  }

  *spillWorkId = bestWorkId;
  return bestPhysId;
}